

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O0

void __thiscall
jsoncons::jsonschema::
enum_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::do_validate
          (enum_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
           *this)

{
  error_reporter *in_stack_00000210;
  evaluation_results *in_stack_00000218;
  json_pointer *in_stack_00000220;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_00000228;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_00000230;
  enum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_00000238;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_00000250;
  
  enum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  do_validate(in_stack_00000238,in_stack_00000230,in_stack_00000228,in_stack_00000220,
              in_stack_00000218,in_stack_00000210,in_stack_00000250);
  return;
}

Assistant:

walk_result do_validate(const eval_context<Json>& context, const Json& instance, 
            const jsonpointer::json_pointer& instance_location,
            evaluation_results& /*results*/, 
            error_reporter& reporter,
            Json& /*patch*/) const final
        {
            eval_context<Json> this_context(context, this->keyword_name());

            bool in_range = false;
            for (const auto& item : value_.array_range())
            {
                if (item == instance) 
                {
                    in_range = true;
                    break;
                }
            }

            if (!in_range)
            {
                walk_result result = reporter.error(this->make_validation_message(
                    this_context.eval_path(),
                    instance_location, 
                    "'" + instance.template as<std::string>() + "' is not a valid enum value."));
                if (result == walk_result::abort)
                {
                    return result;
                }
            }
            return walk_result::advance;
        }